

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_sleep(project_monster_handler_context_t *context,wchar_t flag)

{
  _Bool _Var1;
  wchar_t flag_local;
  project_monster_handler_context_t *context_local;
  
  if (((context->seen & 1U) != 0) && (flag != L'\0')) {
    flag_on_dbg(context->lore->flags,0xc,flag,"context->lore->flags","flag");
  }
  if ((flag != L'\0') &&
     (_Var1 = flag_has_dbg(context->mon->race->flags,0xc,flag,"context->mon->race->flags","flag"),
     !_Var1)) {
    context->skipped = true;
    context->dam = L'\0';
  }
  if (((context->charm & 1U) != 0) &&
     (_Var1 = flag_has_dbg(context->mon->race->flags,0xc,0x47,"context->mon->race->flags",
                           "RF_ANIMAL"), _Var1)) {
    context->dam = context->dam / 2 + context->dam;
  }
  if ((context->beguile & 1U) != 0) {
    context->dam = context->dam / 2 + context->dam;
  }
  context->mon_timed[0] = context->dam;
  if ((L'\0' < context->dam) && ((context->seen & 1U) != 0)) {
    context->obvious = true;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_sleep(project_monster_handler_context_t *context, int flag)
{
	if (context->seen && flag) rf_on(context->lore->flags, flag);

	if (flag && !rf_has(context->mon->race->flags, flag)) {
		context->skipped = true;
		context->dam = 0;
	}

	if (context->charm && rf_has(context->mon->race->flags, RF_ANIMAL)) {
		context->dam += context->dam / 2;
	}
	if (context->beguile) {
		context->dam += context->dam / 2;
	}
	context->mon_timed[MON_TMD_SLEEP] = context->dam;
	if (context->dam > 0 && context->seen) context->obvious = true;
	context->dam = 0;

}